

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cxx
# Opt level: O2

void __thiscall glauber::Output::Output(Output *this,VarMap *var_map)

{
  pointer *ppfVar1;
  undefined1 auVar2 [16];
  function<void_(int,_double,_const_glauber::Event_&)> *pfVar3;
  bool bVar4;
  any *paVar5;
  int *piVar6;
  bool *pbVar7;
  long lVar8;
  function<void_(int,_double,_const_glauber::Event_&)> *pfVar9;
  size_type sVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char **ppcVar11;
  runtime_error *prVar12;
  size_type sVar13;
  pointer pfVar14;
  function<void_(int,_double,_const_glauber::Event_&)> *pfVar15;
  function<void_(int,_double,_const_glauber::Event_&)> *pfVar16;
  anon_class_40_2_a59befe2 *__args;
  anon_class_40_2_a59befe2 *__args_00;
  int iVar17;
  __type _Var18;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  undefined1 local_88 [24];
  char *pcStack_70;
  int local_68 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  pointer local_38;
  undefined1 auVar19 [16];
  
  (this->writers_).
  super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->writers_).
  super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->writers_).
  super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)local_88,"number-events",(allocator *)&local_58);
  paVar5 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  piVar6 = boost::any_cast<int_const&>(paVar5);
  iVar17 = *piVar6;
  std::__cxx11::string::~string((string *)local_88);
  _Var18 = std::log10<int>(iVar17);
  std::__cxx11::string::string((string *)local_88,"quiet",(allocator *)&local_58);
  paVar5 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  auVar19._8_8_ = extraout_XMM1_Qb;
  auVar19._0_8_ = extraout_XMM1_Qa;
  pbVar7 = boost::any_cast<bool_const&>(paVar5);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = _Var18;
  auVar2 = vroundsd_avx(auVar19,auVar2,10);
  bVar4 = *pbVar7;
  iVar17 = (int)auVar2._0_8_;
  std::__cxx11::string::~string((string *)local_88);
  if (bVar4 == false) {
    pfVar16 = (this->writers_).
              super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pfVar16 ==
        (this->writers_).
        super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      sVar13 = std::
               vector<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
               ::_M_check_len(&this->writers_,1,"vector::_M_realloc_insert");
      local_38 = (this->writers_).
                 super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      pfVar3 = (this->writers_).
               super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pfVar14 = std::
                _Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
                ::_M_allocate((_Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
                               *)this,sVar13);
      lVar8 = (long)pfVar16 - (long)pfVar3;
      *(undefined8 *)((long)pfVar14 + lVar8) = 0;
      ((undefined8 *)((long)pfVar14 + lVar8))[1] = 0;
      *(int *)((long)pfVar14 + lVar8) = iVar17;
      *(code **)((long)pfVar14 + lVar8 + 0x18) =
           std::
           _Function_handler<void_(int,_double,_const_glauber::Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jbernhard[P]glauber-model/src/output.cxx:190:7)>
           ::_M_invoke;
      *(code **)((long)pfVar14 + lVar8 + 0x10) =
           std::
           _Function_handler<void_(int,_double,_const_glauber::Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jbernhard[P]glauber-model/src/output.cxx:190:7)>
           ::_M_manager;
      pfVar9 = std::
               __relocate_a_1<std::function<void(int,double,glauber::Event_const&)>*,std::function<void(int,double,glauber::Event_const&)>*,std::allocator<std::function<void(int,double,glauber::Event_const&)>>>
                         (pfVar3,pfVar16,pfVar14,
                          (allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_> *)
                          this);
      pfVar16 = std::
                __relocate_a_1<std::function<void(int,double,glauber::Event_const&)>*,std::function<void(int,double,glauber::Event_const&)>*,std::allocator<std::function<void(int,double,glauber::Event_const&)>>>
                          (pfVar16,local_38,pfVar9 + 1,
                           (allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_> *)
                           this);
      if (pfVar3 != (function<void_(int,_double,_const_glauber::Event_&)> *)0x0) {
        operator_delete(pfVar3);
      }
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pfVar14;
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pfVar16;
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pfVar14 + sVar13;
    }
    else {
      *(undefined8 *)&(pfVar16->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(pfVar16->super__Function_base)._M_functor + 8) = 0;
      *(int *)&(pfVar16->super__Function_base)._M_functor = iVar17;
      pfVar16->_M_invoker =
           std::
           _Function_handler<void_(int,_double,_const_glauber::Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jbernhard[P]glauber-model/src/output.cxx:190:7)>
           ::_M_invoke;
      (pfVar16->super__Function_base)._M_manager =
           std::
           _Function_handler<void_(int,_double,_const_glauber::Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jbernhard[P]glauber-model/src/output.cxx:190:7)>
           ::_M_manager;
      ppfVar1 = &(this->writers_).
                 super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppfVar1 = *ppfVar1 + 1;
    }
  }
  std::__cxx11::string::string((string *)local_88,"output",(allocator *)&local_58);
  sVar10 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    *)(var_map + 0x10),(key_type *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  if (sVar10 != 0) {
    std::__cxx11::string::string((string *)local_88,"output",(allocator *)&local_58);
    paVar5 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
    __rhs = &boost::any_cast<boost::filesystem::path_const&>(paVar5)->m_pathname;
    std::__cxx11::string::~string((string *)local_88);
    bVar4 = boost::filesystem::path::has_extension((path *)__rhs);
    if (bVar4) {
      local_88._0_8_ = ".hdf5";
      local_88._8_8_ = ".hdf";
      local_88._16_8_ = ".hd5";
      pcStack_70 = ".h5";
      boost::filesystem::path::extension();
      ppcVar11 = std::
                 __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_equals_val<boost::filesystem::path_const>>
                           (local_88,local_68,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      if (ppcVar11 != (char **)local_68) {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar12,"HDF5 output was not compiled");
        __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    bVar4 = boost::filesystem::exists((path *)__rhs);
    if (bVar4) {
      bVar4 = boost::filesystem::is_empty((path *)__rhs);
      if (!bVar4) {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_58,"output directory \'",__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88
                       ,&local_58,"\' must be empty");
        std::runtime_error::runtime_error(prVar12,(string *)local_88);
        __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      boost::filesystem::create_directories((path *)__rhs);
    }
    std::__cxx11::string::string((string *)local_88,(string *)__rhs);
    pfVar16 = (this->writers_).
              super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_68[0] = iVar17;
    if (pfVar16 ==
        (this->writers_).
        super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      sVar13 = std::
               vector<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
               ::_M_check_len(&this->writers_,1,"vector::_M_realloc_insert");
      pfVar3 = (this->writers_).
               super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pfVar9 = (this->writers_).
               super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pfVar14 = std::
                _Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
                ::_M_allocate((_Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
                               *)this,sVar13);
      std::allocator_traits<std::allocator<std::function<void(int,double,glauber::Event_const&)>>>::
      construct<std::function<void(int,double,glauber::Event_const&)>,glauber::Output::Output(boost::program_options::variables_map_const&)::__1>
                ((allocator_type *)(((long)pfVar16 - (long)pfVar9) + (long)pfVar14),
                 (function<void_(int,_double,_const_glauber::Event_&)> *)local_88,__args_00);
      pfVar15 = std::
                __relocate_a_1<std::function<void(int,double,glauber::Event_const&)>*,std::function<void(int,double,glauber::Event_const&)>*,std::allocator<std::function<void(int,double,glauber::Event_const&)>>>
                          (pfVar9,pfVar16,pfVar14,
                           (allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_> *)
                           this);
      pfVar16 = std::
                __relocate_a_1<std::function<void(int,double,glauber::Event_const&)>*,std::function<void(int,double,glauber::Event_const&)>*,std::allocator<std::function<void(int,double,glauber::Event_const&)>>>
                          (pfVar16,pfVar3,pfVar15 + 1,
                           (allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_> *)
                           this);
      if (pfVar9 != (function<void_(int,_double,_const_glauber::Event_&)> *)0x0) {
        operator_delete(pfVar9);
      }
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pfVar14;
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pfVar16;
      (this->writers_).
      super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pfVar14 + sVar13;
    }
    else {
      std::allocator_traits<std::allocator<std::function<void(int,double,glauber::Event_const&)>>>::
      construct<std::function<void(int,double,glauber::Event_const&)>,glauber::Output::Output(boost::program_options::variables_map_const&)::__1>
                ((allocator_type *)pfVar16,
                 (function<void_(int,_double,_const_glauber::Event_&)> *)local_88,__args);
      ppfVar1 = &(this->writers_).
                 super__Vector_base<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppfVar1 = *ppfVar1 + 1;
    }
    std::__cxx11::string::~string((string *)local_88);
  }
  return;
}

Assistant:

Output::Output(const VarMap& var_map) {
  // Determine the required width (padding) of the event number.  For example if
  // there are 10 events, the numbers are 0-9 and so no padding is necessary.
  // However given 11 events, the numbers are 00-10 with padded 00, 01, ...
  auto nevents = var_map["number-events"].as<int>();
  auto width = static_cast<int>(std::ceil(std::log10(nevents)));

  // Write to stdout unless the quiet option was specified.
  if (!var_map["quiet"].as<bool>()) {
    writers_.emplace_back(
      [width](int num, double impact_param, const Event& event) {
        write_stream(std::cout, width, num, impact_param, event);
      }
    );
  }

  // Possibly write to text or HDF5 files.
  if (var_map.count("output")) {
    const auto& output_path = var_map["output"].as<fs::path>();
    if (is_hdf5(output_path)) {
#ifdef GLAUBER_HDF5
      if (fs::exists(output_path))
        throw std::runtime_error{"file '" + output_path.string() +
                                 "' exists, will not overwrite"};
      writers_.emplace_back(HDF5Writer{output_path});
#else
      throw std::runtime_error{"HDF5 output was not compiled"};
#endif  // GLAUBER_HDF5
    } else {
      // Text files are all written into a single directory.  Require the
      // directory to be initially empty to avoid accidental overwriting and/or
      // spewing files into an already-used location.  If the directory does not
      // exist, create it.
      if (fs::exists(output_path)) {
        if (!fs::is_empty(output_path)) {
          throw std::runtime_error{"output directory '" + output_path.string() +
                                   "' must be empty"};
        }
      } else {
        fs::create_directories(output_path);
      }
      writers_.emplace_back(
        [output_path, width](int num, double impact_param, const Event& event) {
          write_text_file(output_path, width, num, impact_param, event);
        }
      );
    }
  }
}